

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O1

void init_gost2012_hash_ctx(gost2012_hash_ctx *CTX,uint digest_size)

{
  memset(CTX,0,0x110);
  CTX->digest_size = digest_size;
  if (digest_size == 0x100) {
    (CTX->h).QWORD[6] = 0x101010101010101;
    (CTX->h).QWORD[7] = 0x101010101010101;
    (CTX->h).QWORD[4] = 0x101010101010101;
    (CTX->h).QWORD[5] = 0x101010101010101;
    (CTX->h).QWORD[2] = 0x101010101010101;
    (CTX->h).QWORD[3] = 0x101010101010101;
    (CTX->h).QWORD[0] = 0x101010101010101;
    (CTX->h).QWORD[1] = 0x101010101010101;
  }
  return;
}

Assistant:

void init_gost2012_hash_ctx(gost2012_hash_ctx * CTX,
                            const unsigned int digest_size)
{
    memset(CTX, 0, sizeof(gost2012_hash_ctx));

    CTX->digest_size = digest_size;
    /*
     * IV for 512-bit hash should be 0^512
     * IV for 256-bit hash should be (00000001)^64
     *
     * It's already zeroed when CTX is cleared above, so we only
     * need to set it to 0x01-s for 256-bit hash.
     */
    if (digest_size == 256)
        memset(&CTX->h, 0x01, sizeof(uint512_u));
}